

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

bool __thiscall Gluco::Solver::locked(Solver *this,Clause *c)

{
  bool bVar1;
  int iVar2;
  CRef CVar3;
  Lit LVar4;
  Clause *pCVar5;
  bool local_89;
  bool local_69;
  lbool local_51;
  int local_50;
  lbool local_49;
  int local_48;
  int local_44;
  lbool local_3d;
  int local_3c;
  lbool local_35;
  int local_34;
  int local_30;
  lbool local_29;
  int local_28;
  lbool local_21;
  Clause *local_20;
  Clause *c_local;
  Solver *this_local;
  
  local_20 = c;
  c_local = (Clause *)this;
  iVar2 = Clause::size(c);
  if (2 < iVar2) {
    local_28 = (int)Clause::operator[](local_20,0);
    local_21 = value(this,(Lit)local_28);
    lbool::lbool(&local_29,'\0');
    bVar1 = lbool::operator==(&local_21,local_29);
    local_69 = false;
    if (bVar1) {
      local_30 = (int)Clause::operator[](local_20,0);
      iVar2 = Gluco::var((Lit)local_30);
      CVar3 = reason(this,iVar2);
      local_69 = false;
      if (CVar3 != 0xffffffff) {
        local_34 = (int)Clause::operator[](local_20,0);
        iVar2 = Gluco::var((Lit)local_34);
        CVar3 = reason(this,iVar2);
        pCVar5 = ClauseAllocator::lea(&this->ca,CVar3);
        local_69 = pCVar5 == local_20;
      }
    }
    return local_69;
  }
  local_3c = (int)Clause::operator[](local_20,0);
  local_35 = value(this,(Lit)local_3c);
  lbool::lbool(&local_3d,'\0');
  bVar1 = lbool::operator==(&local_35,local_3d);
  if (bVar1) {
    local_44 = (int)Clause::operator[](local_20,0);
    iVar2 = Gluco::var((Lit)local_44);
    CVar3 = reason(this,iVar2);
    if (CVar3 != 0xffffffff) {
      local_48 = (int)Clause::operator[](local_20,0);
      iVar2 = Gluco::var((Lit)local_48);
      CVar3 = reason(this,iVar2);
      pCVar5 = ClauseAllocator::lea(&this->ca,CVar3);
      if (pCVar5 == local_20) {
        return true;
      }
    }
  }
  local_50 = (int)Clause::operator[](local_20,1);
  local_49 = value(this,(Lit)local_50);
  lbool::lbool(&local_51,'\0');
  bVar1 = lbool::operator==(&local_49,local_51);
  local_89 = false;
  if (bVar1) {
    LVar4 = Clause::operator[](local_20,1);
    iVar2 = Gluco::var(LVar4);
    CVar3 = reason(this,iVar2);
    local_89 = false;
    if (CVar3 != 0xffffffff) {
      LVar4 = Clause::operator[](local_20,1);
      iVar2 = Gluco::var(LVar4);
      CVar3 = reason(this,iVar2);
      pCVar5 = ClauseAllocator::lea(&this->ca,CVar3);
      local_89 = pCVar5 == local_20;
    }
  }
  return local_89;
}

Assistant:

inline bool     Solver::locked          (const Clause& c) const { 
   if(c.size()>2) 
     return value(c[0]) == l_True && reason(var(c[0])) != CRef_Undef && ca.lea(reason(var(c[0]))) == &c; 
   return 
     (value(c[0]) == l_True && reason(var(c[0])) != CRef_Undef && ca.lea(reason(var(c[0]))) == &c)
     || 
     (value(c[1]) == l_True && reason(var(c[1])) != CRef_Undef && ca.lea(reason(var(c[1]))) == &c);
 }